

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateTessCoordAtDefinition
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst)

{
  Instruction *inst_00;
  Instruction *decoration_00;
  bool bVar1;
  spv_result_t sVar2;
  spv_const_context psVar3;
  anon_class_16_2_3fe15001 local_60;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_50;
  undefined4 local_2c;
  Instruction *pIStack_28;
  spv_result_t error;
  Instruction *inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  pIStack_28 = inst;
  inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  psVar3 = ValidationState_t::context(this->_);
  bVar1 = spvIsVulkanEnv(psVar3->target_env);
  decoration_00 = inst_local;
  inst_00 = pIStack_28;
  if (bVar1) {
    local_60.inst = pIStack_28;
    local_60.this = this;
    std::function<spv_result_t(std::__cxx11::string_const&)>::
    function<spvtools::val::(anonymous_namespace)::BuiltInsValidator::ValidateTessCoordAtDefinition(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&)::__0,void>
              ((function<spv_result_t(std::__cxx11::string_const&)> *)&local_50,&local_60);
    sVar2 = ValidateF32Vec(this,(Decoration *)decoration_00,inst_00,3,&local_50);
    std::
    function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_50);
    if (sVar2 != SPV_SUCCESS) {
      return sVar2;
    }
    local_2c = 0;
  }
  sVar2 = ValidateTessCoordAtReference
                    (this,(Decoration *)inst_local,pIStack_28,pIStack_28,pIStack_28);
  return sVar2;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateTessCoordAtDefinition(
    const Decoration& decoration, const Instruction& inst) {
  if (spvIsVulkanEnv(_.context()->target_env)) {
    if (spv_result_t error = ValidateF32Vec(
            decoration, inst, 3,
            [this, &inst](const std::string& message) -> spv_result_t {
              return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                     << _.VkErrorID(4389)
                     << "According to the Vulkan spec BuiltIn TessCoord "
                        "variable needs to be a 3-component 32-bit float "
                        "vector. "
                     << message;
            })) {
      return error;
    }
  }

  // Seed at reference checks with this built-in.
  return ValidateTessCoordAtReference(decoration, inst, inst, inst);
}